

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O0

void __thiscall
avro::EnumParser::EnumParser
          (EnumParser *this,ResolverFactory *factory,NodePtr *writer,NodePtr *reader,
          CompoundLayout *offsets)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *p_Var1;
  int iVar2;
  Layout *this_00;
  pointer __n;
  type pNVar3;
  undefined4 extraout_var;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  undefined4 extraout_var_01;
  shared_ptr<avro::Node> *in_RCX;
  shared_ptr<avro::Node> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_t readerIndex;
  string *name;
  size_t i;
  size_t writerSize;
  size_t in_stack_ffffffffffffff58;
  CompoundLayout *in_stack_ffffffffffffff60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  pointer local_58;
  undefined8 local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  shared_ptr<avro::Node> *local_20;
  shared_ptr<avro::Node> *local_18;
  undefined4 extraout_var_00;
  
  (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  Resolver::Resolver((Resolver *)in_RDI);
  (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_parse_00312070;
  p_Var1 = &in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
  this_00 = CompoundLayout::at(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  __n = (pointer)Layout::offset(this_00);
  (p_Var1->_M_impl).super__Vector_impl_data._M_finish = __n;
  p_Var1 = &in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(local_20);
  iVar2 = (*pNVar3->_vptr_Node[7])();
  (p_Var1->_M_impl).super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(extraout_var,iVar2);
  __x = in_RDI + 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c4268);
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(local_18);
  iVar2 = (*pNVar3->_vptr_Node[7])();
  this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(extraout_var_00,iVar2)
  ;
  local_40 = this_01;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(in_RDI,(size_type)__n);
  for (local_48 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0; local_48 < local_40;
      local_48 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(local_48->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    pNVar3 = boost::shared_ptr<avro::Node>::operator->(local_18);
    iVar2 = (*pNVar3->_vptr_Node[8])(pNVar3,(ulong)local_48 & 0xffffffff);
    local_50 = CONCAT44(extraout_var_01,iVar2);
    local_58 = (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pNVar3 = boost::shared_ptr<avro::Node>::operator->(local_20);
    (*pNVar3->_vptr_Node[9])(pNVar3,local_50,&local_58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (this_01,(value_type_conflict2 *)__x);
  }
  return;
}

Assistant:

EnumParser(ResolverFactory &factory, const NodePtr &writer, const NodePtr &reader, const CompoundLayout &offsets) :
        Resolver(),
        offset_(offsets.at(0).offset()),
        readerSize_(reader->names())
    { 
        const size_t writerSize = writer->names();

        mapping_.reserve(writerSize);

        for(size_t i = 0; i < writerSize; ++i) {
            const std::string &name = writer->nameAt(i);
            size_t readerIndex = readerSize_;
            reader->nameIndex(name, readerIndex);
            mapping_.push_back(readerIndex);
        }
    }